

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

bool __thiscall
wallet::WalletBatch::
EraseIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>>
          (WalletBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
          *key)

{
  bool bVar1;
  __int_type_conflict2 _Var2;
  pointer pDVar3;
  __atomic_base<unsigned_int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  DatabaseBatch *this_00;
  
  this_00 = *(DatabaseBatch **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
            (in_stack_ffffffffffffffc8);
  bVar1 = DatabaseBatch::
          Erase<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>>
                    (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
                              *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x50))();
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int(in_RSI);
    if (_Var2 % 1000 == 0) {
      pDVar3 = std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
               operator->(in_stack_ffffffffffffffc8);
      (*pDVar3->_vptr_DatabaseBatch[6])();
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (*(DatabaseBatch **)(in_FS_OFFSET + 0x28) == this_00) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool EraseIC(const K& key)
    {
        if (!m_batch->Erase(key)) {
            return false;
        }
        m_database.IncrementUpdateCounter();
        if (m_database.nUpdateCounter % 1000 == 0) {
            m_batch->Flush();
        }
        return true;
    }